

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source.cc
# Opt level: O1

MaskImage * __thiscall
DataSourceBase::separate_sprites
          (MaskImage *__return_storage_ptr__,DataSourceBase *this,PSprite *s1,PSprite *s2)

{
  element_type *peVar1;
  PSprite filled;
  PSprite masked;
  shared_ptr<Data::Sprite> local_70;
  long *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  long *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  element_type *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  element_type *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  element_type *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  peVar1 = (s1->super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((peVar1 == (element_type *)0x0) ||
     (local_20 = (s2->super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
     local_20 == (element_type *)0x0)) {
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_std::shared_ptr<Data::Sprite>,_std::shared_ptr<Data::Sprite>_>).
    super__Head_base<0UL,_std::shared_ptr<Data::Sprite>,_false>._M_head_impl.
    super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_std::shared_ptr<Data::Sprite>,_std::shared_ptr<Data::Sprite>_>).
    super__Head_base<0UL,_std::shared_ptr<Data::Sprite>,_false>._M_head_impl.
    super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_std::shared_ptr<Data::Sprite>,_std::shared_ptr<Data::Sprite>_>).
    super__Tuple_impl<1UL,_std::shared_ptr<Data::Sprite>_>.
    super__Head_base<1UL,_std::shared_ptr<Data::Sprite>,_false>._M_head_impl.
    super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_std::shared_ptr<Data::Sprite>,_std::shared_ptr<Data::Sprite>_>).
    super__Tuple_impl<1UL,_std::shared_ptr<Data::Sprite>_>.
    super__Head_base<1UL,_std::shared_ptr<Data::Sprite>,_false>._M_head_impl.
    super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_18 = (s2->super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_18->_M_use_count = local_18->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_18->_M_use_count = local_18->_M_use_count + 1;
      }
    }
    (*peVar1->_vptr_Sprite[8])(&local_70,peVar1,&local_20);
    if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
    }
    peVar1 = (s1->super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_30 = local_70.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_28 = local_70.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
    if (local_70.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_70.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_70.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_70.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_70.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    (*peVar1->_vptr_Sprite[7])(&local_60,peVar1,&local_30);
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
    (**(code **)(*local_60 + 0x70))();
    peVar1 = (s1->super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_40 = local_70.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_38 = local_70.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
    if (local_70.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_70.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_70.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_70.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_70.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    (*peVar1->_vptr_Sprite[0xc])(peVar1,&local_40);
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    peVar1 = (s1->super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_50 = local_60;
    local_48 = local_58;
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_58->_M_use_count = local_58->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_58->_M_use_count = local_58->_M_use_count + 1;
      }
    }
    (*peVar1->_vptr_Sprite[0xf])(peVar1,&local_50,0,0);
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
    std::_Tuple_impl<0ul,std::shared_ptr<Data::Sprite>,std::shared_ptr<Data::Sprite>>::
    _Tuple_impl<std::shared_ptr<Data::Sprite>&,std::shared_ptr<Data::Sprite>&,void>
              (&__return_storage_ptr__->
                super__Tuple_impl<0UL,_std::shared_ptr<Data::Sprite>,_std::shared_ptr<Data::Sprite>_>
               ,&local_70,s1);
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    if (local_70.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Data::MaskImage
DataSourceBase::separate_sprites(Data::PSprite s1, Data::PSprite s2) {
  if (!s1 || !s2) {
    return std::make_tuple(nullptr, nullptr);
  }

  Data::PSprite filled = s1->create_mask(s2);
  Data::PSprite masked = s1->get_masked(filled);
  masked->make_alpha_mask();
  s1->del(filled);
  s1->stick(masked, 0, 0);

  return std::make_tuple(filled, s1);
}